

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec.c
# Opt level: O1

int rtr_bgpsec_has_algorithm_suite(uint8_t alg_suite)

{
  bool bVar1;
  bool bVar2;
  long in_FS_OFFSET;
  
  bVar2 = true;
  do {
    bVar1 = bVar2;
    if (alg_suite == '\x01') break;
    bVar2 = false;
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar1 - 1;
  }
  __stack_chk_fail();
}

Assistant:

int rtr_bgpsec_has_algorithm_suite(uint8_t alg_suite)
{
	int alg_suites_len = sizeof(algorithm_suites) / sizeof(uint8_t);

	for (int i = 0; i < alg_suites_len; i++) {
		if (alg_suite == algorithm_suites[i])
			return RTR_BGPSEC_SUCCESS;
	}

	return RTR_BGPSEC_ERROR;
}